

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amplificationstobin.cpp
# Opt level: O2

void amplificationstobin::DoIt(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  item_amplification ia;
  char line [4096];
  
  WriteOpts();
  fgets(line,0x1000,_stdin);
  uVar3 = 1;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(line,"%d,%d",&ia,&ia.amplification_id);
    if (iVar1 != 2) break;
    if (uVar3 != ia.item_id) {
      fprintf(_stderr,
              "FATAL: Item IDs not contiguous:\nExpected item ID %d but read item ID %d on line %d\n"
              ,(ulong)uVar3,(ulong)(uint)ia.item_id,(ulong)(uVar3 + 1));
      goto LAB_0010136f;
    }
    uVar3 = uVar3 + 1;
    fwrite(&ia,8,1,_stdout);
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s\n",(ulong)(uVar3 + 1),line);
LAB_0010136f:
  exit(1);
}

Assistant:

void DoIt() {

    WriteOpts();

    int expected_item_id = 1;
    item_amplification ia;
    char line[4096];

    fgets(line, sizeof(line), stdin);   // Skip header row
    int lineno = 2;

    while (fgets(line, sizeof(line), stdin) != 0) {

      if (sscanf(line, "%d,%d", &ia.item_id, &ia.amplification_id) != 2) {
        fprintf(stderr, "FATAL: Invalid data in line %d:\n%s\n", lineno, line);
	exit(EXIT_FAILURE);
      }

      if (expected_item_id != ia.item_id) {
        fprintf(stderr, "FATAL: Item IDs not contiguous:\n"
			"Expected item ID %d but read item ID %d on line %d\n",
			expected_item_id, ia.item_id, lineno);
	exit(EXIT_FAILURE);
      }

      ++lineno;
      ++expected_item_id;

      fwrite(&ia, sizeof(ia), 1, stdout);

    }

  }